

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::LoadNumberAllocatorValueOpnd(Lowerer *this,Instr *instr,NumberAllocatorValue valueType)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  int iVar5;
  ScriptContextInfo *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar7;
  uint local_4c;
  bool allowNativeCodeBumpAllocation;
  ScriptContextInfo *scriptContext;
  NumberAllocatorValue valueType_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pSVar6 = Func::GetScriptContextInfo(instr->m_func);
  uVar3 = (*pSVar6->_vptr_ScriptContextInfo[0x1d])();
  if (valueType == NumberAllocatorEndAddress) {
    iVar5 = (*pSVar6->_vptr_ScriptContextInfo[0x1b])();
    uVar4 = Memory::RecyclerFastAllocator<Js::JavascriptNumber,_(Memory::ObjectInfoBits)32>::
            GetEndAddressOffset();
    this_local = (Lowerer *)
                 IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var,iVar5) + (ulong)uVar4),TyUint64,
                                     instr->m_func,AddrOpndKindDynamicMisc);
  }
  else if (valueType == NumberAllocatorFreeObjectList) {
    iVar5 = (*pSVar6->_vptr_ScriptContextInfo[0x1b])();
    if ((uVar3 & 1) == 0) {
      local_4c = Memory::RecyclerFastAllocator<Js::JavascriptNumber,_(Memory::ObjectInfoBits)32>::
                 GetEndAddressOffset();
    }
    else {
      local_4c = Memory::RecyclerFastAllocator<Js::JavascriptNumber,_(Memory::ObjectInfoBits)32>::
                 GetFreeObjectListOffset();
    }
    this_local = (Lowerer *)
                 IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var_00,iVar5) + (ulong)local_4c),
                                     TyUint64,instr->m_func,AddrOpndKindDynamicMisc);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xccb,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    this_local = (Lowerer *)0x0;
  }
  return (Opnd *)this_local;
}

Assistant:

IR::Opnd *
Lowerer::LoadNumberAllocatorValueOpnd(IR::Instr *instr, NumberAllocatorValue valueType)
{
    ScriptContextInfo *scriptContext = instr->m_func->GetScriptContextInfo();
    bool allowNativeCodeBumpAllocation = scriptContext->GetRecyclerAllowNativeCodeBumpAllocation();

    switch (valueType)
    {
    case NumberAllocatorValue::NumberAllocatorEndAddress:
        return IR::MemRefOpnd::New(((char *)scriptContext->GetNumberAllocatorAddr()) + Js::RecyclerJavascriptNumberAllocator::GetEndAddressOffset(), TyMachPtr, instr->m_func);
    case NumberAllocatorValue::NumberAllocatorFreeObjectList:
        return IR::MemRefOpnd::New(
            ((char *)scriptContext->GetNumberAllocatorAddr()) +
                (allowNativeCodeBumpAllocation ? Js::RecyclerJavascriptNumberAllocator::GetFreeObjectListOffset() : Js::RecyclerJavascriptNumberAllocator::GetEndAddressOffset()),
            TyMachPtr, instr->m_func);
    default:
        Assert(false);
        return nullptr;
    }
}